

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::detail::remove_escaped_characters(string *__return_storage_ptr__,string *str)

{
  void *pvVar1;
  char cVar2;
  void *pvVar3;
  long lVar4;
  invalid_argument *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  uint32_t uVar13;
  char *pcVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,str->_M_string_length);
  if (0 < (long)str->_M_string_length) {
    pcVar14 = (str->_M_dataplus)._M_p;
    pcVar11 = pcVar14 + str->_M_string_length;
    do {
      pvVar1 = escapedCharsCode_abi_cxx11_;
      if (*pcVar14 == '\\') {
        uVar12 = (long)pcVar11 - (long)pcVar14;
        if ((long)uVar12 < 2) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::operator+(&local_b0,"invalid escape sequence ",str);
          ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
          __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                      ::std::invalid_argument::~invalid_argument);
        }
        cVar2 = pcVar14[1];
        if (DAT_005754a0 == 0) {
LAB_0019df81:
          if (cVar2 != '0') {
            if (cVar2 == 'U') {
              if (uVar12 < 10) {
                piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                ::std::operator+(&local_b0,"unicode sequence must have 8 hex codes ",str);
                ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
                __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                            ::std::invalid_argument::~invalid_argument);
              }
              lVar4 = 0;
              uVar7 = 0x10000000;
              uVar13 = 0;
              do {
                cVar2 = pcVar14[lVar4 + 2];
                iVar9 = (int)cVar2;
                if ((byte)(cVar2 - 0x30U) < 10) {
                  uVar10 = iVar9 - 0x30;
                }
                else if ((byte)(cVar2 + 0xbfU) < 6) {
                  uVar10 = iVar9 - 0x37;
                }
                else {
                  if (5 < (byte)(cVar2 + 0x9fU)) goto LAB_0019e134;
                  uVar10 = iVar9 - 0x57;
                }
                if (0xf < uVar10) {
LAB_0019e134:
                  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  ::std::operator+(&local_b0,"unicode sequence must have 8 hex codes ",str);
                  ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
                  __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                              ::std::invalid_argument::~invalid_argument);
                }
                uVar13 = uVar13 + uVar10 * uVar7;
                uVar7 = uVar7 >> 4;
                lVar4 = lVar4 + 1;
              } while (lVar4 != 8);
              append_codepoint(__return_storage_ptr__,uVar13);
              pcVar14 = pcVar14 + 9;
            }
            else {
              if (cVar2 != 'u') {
                piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_90,"unrecognized escape sequence \\","");
                ::std::operator+(&local_50,&local_90,pcVar14[1]);
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_50," in ");
                local_70._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                paVar8 = &pbVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p == paVar8) {
                  local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                }
                else {
                  local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                }
                local_70._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                ::std::operator+(&local_b0,&local_70,str);
                ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
                __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                            ::std::invalid_argument::~invalid_argument);
              }
              if (uVar12 < 6) {
                piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                ::std::operator+(&local_b0,"unicode sequence must have 4 hex codes ",str);
                ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
                __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                            ::std::invalid_argument::~invalid_argument);
              }
              lVar4 = 0;
              uVar7 = 0x1000;
              uVar13 = 0;
              do {
                cVar2 = pcVar14[lVar4 + 2];
                iVar9 = (int)cVar2;
                if ((byte)(cVar2 - 0x30U) < 10) {
                  uVar10 = iVar9 - 0x30;
                }
                else if ((byte)(cVar2 + 0xbfU) < 6) {
                  uVar10 = iVar9 - 0x37;
                }
                else {
                  if (5 < (byte)(cVar2 + 0x9fU)) goto LAB_0019e0e7;
                  uVar10 = iVar9 - 0x57;
                }
                if (0xf < uVar10) {
LAB_0019e0e7:
                  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  ::std::operator+(&local_b0,"unicode sequence must have 4 hex codes ",str);
                  ::std::invalid_argument::invalid_argument(piVar5,(string *)&local_b0);
                  __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                              ::std::invalid_argument::~invalid_argument);
                }
                uVar13 = uVar13 + uVar10 * uVar7;
                uVar7 = uVar7 >> 4;
                lVar4 = lVar4 + 1;
              } while (lVar4 != 4);
              append_codepoint(__return_storage_ptr__,uVar13);
              pcVar14 = pcVar14 + 5;
            }
            goto LAB_0019e0bc;
          }
          cVar2 = '\0';
        }
        else {
          pvVar3 = memchr(escapedCharsCode_abi_cxx11_,(int)cVar2,DAT_005754a0);
          if ((long)pvVar3 - (long)pvVar1 == -1 || pvVar3 == (void *)0x0) goto LAB_0019df81;
          cVar2 = *(char *)(escapedChars_abi_cxx11_ + ((long)pvVar3 - (long)pvVar1));
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,cVar2);
        pcVar14 = pcVar14 + 1;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,*pcVar14);
      }
LAB_0019e0bc:
      pcVar14 = pcVar14 + 1;
      pcVar11 = (str->_M_dataplus)._M_p + str->_M_string_length;
    } while (pcVar14 < pcVar11);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string remove_escaped_characters(const std::string &str) {

    std::string out;
    out.reserve(str.size());
    for(auto loc = str.begin(); loc < str.end(); ++loc) {
        if(*loc == '\\') {
            if(str.end() - loc < 2) {
                throw std::invalid_argument("invalid escape sequence " + str);
            }
            auto ecloc = escapedCharsCode.find_first_of(*(loc + 1));
            if(ecloc != std::string::npos) {
                out.push_back(escapedChars[ecloc]);
                ++loc;
            } else if(*(loc + 1) == 'u') {
                // must have 4 hex characters
                if(str.end() - loc < 6) {
                    throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16};
                for(int ii = 2; ii < 6; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 5;
            } else if(*(loc + 1) == 'U') {
                // must have 8 hex characters
                if(str.end() - loc < 10) {
                    throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16 * 16 * 16 * 16 * 16};
                for(int ii = 2; ii < 10; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 9;
            } else if(*(loc + 1) == '0') {
                out.push_back('\0');
                ++loc;
            } else {
                throw std::invalid_argument(std::string("unrecognized escape sequence \\") + *(loc + 1) + " in " + str);
            }
        } else {
            out.push_back(*loc);
        }
    }
    return out;
}